

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void duckdb_parquet::swap(PageHeader *a,PageHeader *b)

{
  _PageHeader__isset _Var1;
  int32_t iVar2;
  type tVar3;
  int32_t iVar4;
  
  iVar2 = b->uncompressed_page_size;
  tVar3 = a->type;
  iVar4 = a->uncompressed_page_size;
  a->type = b->type;
  a->uncompressed_page_size = iVar2;
  b->type = tVar3;
  b->uncompressed_page_size = iVar4;
  iVar2 = a->compressed_page_size;
  a->compressed_page_size = b->compressed_page_size;
  b->compressed_page_size = iVar2;
  iVar2 = a->crc;
  a->crc = b->crc;
  b->crc = iVar2;
  swap(&a->data_page_header,&b->data_page_header);
  swap(&a->dictionary_page_header,&b->dictionary_page_header);
  swap(&a->data_page_header_v2,&b->data_page_header_v2);
  _Var1 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var1;
  return;
}

Assistant:

void swap(PageHeader &a, PageHeader &b) {
  using ::std::swap;
  swap(a.type, b.type);
  swap(a.uncompressed_page_size, b.uncompressed_page_size);
  swap(a.compressed_page_size, b.compressed_page_size);
  swap(a.crc, b.crc);
  swap(a.data_page_header, b.data_page_header);
  swap(a.index_page_header, b.index_page_header);
  swap(a.dictionary_page_header, b.dictionary_page_header);
  swap(a.data_page_header_v2, b.data_page_header_v2);
  swap(a.__isset, b.__isset);
}